

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

void __thiscall ncnn::Mat::create(Mat *this,int _w,size_t _elemsize,Allocator *_allocator)

{
  size_t sVar1;
  void *pvVar2;
  Allocator *in_RCX;
  size_t in_RDX;
  int in_ESI;
  Mat *in_RDI;
  size_t totalsize;
  
  if ((((in_RDI->dims != 1) || (in_RDI->w != in_ESI)) || (in_RDI->elemsize != in_RDX)) ||
     ((in_RDI->packing != 1 || (in_RDI->allocator != in_RCX)))) {
    release(in_RDI);
    in_RDI->elemsize = in_RDX;
    in_RDI->packing = 1;
    in_RDI->allocator = in_RCX;
    in_RDI->dims = 1;
    in_RDI->w = in_ESI;
    in_RDI->h = 1;
    in_RDI->c = 1;
    in_RDI->cstep = (long)in_RDI->w;
    sVar1 = total(in_RDI);
    if (sVar1 != 0) {
      sVar1 = total(in_RDI);
      sVar1 = ncnn::alignSize(sVar1 * in_RDI->elemsize,4);
      if (in_RDI->allocator == (Allocator *)0x0) {
        pvVar2 = ncnn::fastMalloc((size_t)in_RDI);
        in_RDI->data = pvVar2;
      }
      else {
        pvVar2 = (void *)(**(code **)(*(long *)in_RDI->allocator + 0x10))
                                   (in_RDI->allocator,sVar1 + 4);
        in_RDI->data = pvVar2;
      }
      in_RDI->refcount = (int *)((long)in_RDI->data + sVar1);
      *in_RDI->refcount = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 1 && w == _w && elemsize == _elemsize && packing == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    packing = 1;
    allocator = _allocator;

    dims = 1;
    w = _w;
    h = 1;
    c = 1;

    cstep = w;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}